

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int decode_encoded_header_info(archive_read *a,_7z_stream_info *si)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  _7zip *zip;
  _7z_stream_info *si_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar2 = read_StreamsInfo(a,si);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) {
      archive_set_error(&a->archive,-1,"Couldn\'t allocate memory");
    }
    else {
      archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
    }
    a_local._4_4_ = -0x1e;
  }
  else if (((si->pi).numPackStreams == 0) || ((si->ci).numFolders == 0)) {
    archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
    a_local._4_4_ = -0x1e;
  }
  else if ((*(ulong *)((long)pvVar1 + 0x80) < (si->pi).pos + *(si->pi).sizes) ||
          ((((long)((si->pi).pos + *(si->pi).sizes) < 0 || (*(si->pi).sizes == 0)) ||
           ((long)(si->pi).pos < 0)))) {
    archive_set_error(&a->archive,-1,"Malformed Header offset");
    a_local._4_4_ = -0x1e;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
decode_encoded_header_info(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;

	errno = 0;
	if (read_StreamsInfo(a, si) < 0) {
		if (errno == ENOMEM)
			archive_set_error(&a->archive, -1,
			    "Couldn't allocate memory");
		else
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}

	if (si->pi.numPackStreams == 0 || si->ci.numFolders == 0) {
		archive_set_error(&a->archive, -1, "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}

	if (zip->header_offset < si->pi.pos + si->pi.sizes[0] ||
	    (int64_t)(si->pi.pos + si->pi.sizes[0]) < 0 ||
	    si->pi.sizes[0] == 0 || (int64_t)si->pi.pos < 0) {
		archive_set_error(&a->archive, -1, "Malformed Header offset");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}